

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O3

int is_valid_index(char *path,size_t *idx)

{
  size_t sVar1;
  int *piVar2;
  ulong uVar3;
  byte bVar4;
  size_t sVar5;
  
  sVar1 = strlen(path);
  if (sVar1 == 1) {
    bVar4 = *path - 0x30;
    if (9 < bVar4) {
LAB_0010a422:
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      return 0;
    }
    uVar3 = (ulong)bVar4;
  }
  else {
    if (*path == '0') goto LAB_0010a422;
    if (sVar1 != 0) {
      sVar5 = 0;
      do {
        if (9 < (byte)(path[sVar5] - 0x30U)) goto LAB_0010a422;
        sVar5 = sVar5 + 1;
      } while (sVar1 != sVar5);
    }
    uVar3 = strtoull(path,(char **)0x0,10);
  }
  *idx = uVar3;
  return 1;
}

Assistant:

static int is_valid_index(const char *path, size_t *idx)
{
	size_t i, len = strlen(path);
	/* this code-path optimizes a bit, for when we reference the 0-9 index range
	 * in a JSON array and because leading zeros not allowed
	 */
	if (len == 1)
	{
		if (is_plain_digit(path[0]))
		{
			*idx = (path[0] - '0');
			return 1;
		}
		errno = EINVAL;
		return 0;
	}
	/* leading zeros not allowed per RFC */
	if (path[0] == '0')
	{
		errno = EINVAL;
		return 0;
	}
	/* RFC states base-10 decimals */
	for (i = 0; i < len; i++)
	{
		if (!is_plain_digit(path[i]))
		{
			errno = EINVAL;
			return 0;
		}
	}

	// We know it's all digits, so the only error case here is overflow,
	// but ULLONG_MAX will be longer than any array length so that's ok.
	*idx = strtoull(path, NULL, 10);

	return 1;
}